

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O1

void Cba_ManPrintDistribStat(Cba_Man_t *p,int *pCounts,int *pUserCounts)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  long *plVar4;
  
  iVar1 = p->iRoot;
  if (((long)iVar1 < 1) || ((p->vNtks).nSize <= iVar1)) {
    plVar4 = (long *)0x0;
  }
  else {
    plVar4 = (long *)(p->vNtks).pArray[iVar1];
  }
  puts("Primitives:");
  lVar3 = 0;
  do {
    if (pCounts[lVar3] != 0) {
      printf("%-20s = %5d\n",*(undefined8 *)(*plVar4 + 0x70 + lVar3 * 8));
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x5a);
  puts("User hierarchy:");
  if (1 < (p->vNtks).nSize) {
    lVar3 = 1;
    do {
      if (pUserCounts[lVar3] != 0) {
        plVar4 = (long *)(p->vNtks).pArray[lVar3];
        pcVar2 = Abc_NamStr(*(Abc_Nam_t **)(*plVar4 + 0x10),*(int *)((long)plVar4 + 0xc));
        printf("%-20s = %5d\n",pcVar2,(ulong)(uint)pUserCounts[lVar3]);
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < (p->vNtks).nSize);
  }
  return;
}

Assistant:

void Cba_ManPrintDistribStat( Cba_Man_t * p, int * pCounts, int * pUserCounts )
{
    Cba_Ntk_t * pNtk = Cba_ManRoot(p); int i;
    printf( "Primitives:\n" );
    for ( i = 0; i < CBA_BOX_LAST; i++ )
        if ( pCounts[i] )
            printf( "%-20s = %5d\n", Cba_NtkTypeName(pNtk, i), pCounts[i] );
    printf( "User hierarchy:\n" );
    Cba_ManForEachNtk( p, pNtk, i )
        if ( pUserCounts[i] )
            printf( "%-20s = %5d\n", Cba_NtkName(pNtk), pUserCounts[i] );
}